

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O1

void __thiscall Coverage_unitsItem_Test::TestBody(Coverage_unitsItem_Test *this)

{
  char cVar1;
  byte bVar2;
  AssertionResult gtest_ar_;
  UnitsPtr units;
  UnitsItemPtr unitsItemInvalid;
  UnitsItemPtr unitsItemValid;
  long *local_88;
  AssertHelper local_80 [8];
  AssertionResult local_78;
  long local_68 [3];
  byte local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  shared_ptr local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  shared_ptr local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"units","");
  libcellml::Units::create((string *)&local_40);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  local_78._0_8_ = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"second","");
  libcellml::Units::addUnit(local_40);
  if ((long *)local_78._0_8_ != local_68) {
    operator_delete((void *)local_78._0_8_,local_68[0] + 1);
  }
  libcellml::UnitsItem::create(local_20,(ulong)&local_40);
  local_78._0_8_ = (long *)0x0;
  local_78.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  libcellml::UnitsItem::create(local_30,(ulong)&local_78);
  if (local_78.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.message_.ptr_);
  }
  local_50[0] = libcellml::UnitsItem::isValid();
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50[0] == 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(char *)local_50,"unitsItemValid->isValid()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0xb0,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,local_68[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
      local_88 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = libcellml::UnitsItem::isValid();
  local_50[0] = bVar2 ^ 1;
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2 != 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(char *)local_50,"unitsItemInvalid->isValid()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/coverage/coverage.cpp"
               ,0xb1,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(local_80,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_78._0_8_ != local_68) {
      operator_delete((void *)local_78._0_8_,local_68[0] + 1);
    }
    if (local_88 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_88 != (long *)0x0)) {
        (**(code **)(*local_88 + 8))();
      }
      local_88 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Coverage, parserBranchesCMetaIdCellml2)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("coverage/cmeta_id_cellml2.xml"));

    EXPECT_EQ(size_t(0), model->unitsCount());
    EXPECT_EQ(size_t(0), model->componentCount());
}